

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O1

code_point booster::locale::utf::utf_traits<char,1>::decode_valid<char_const*>(char **p)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  
  pbVar2 = (byte *)*p;
  *p = (char *)(pbVar2 + 1);
  bVar1 = *pbVar2;
  uVar3 = (uint)bVar1;
  if (0xbf < bVar1) {
    iVar4 = 1;
    if (0xdf < bVar1) {
      iVar4 = 3 - (uint)(bVar1 < 0xf0);
    }
    uVar3 = ~(-1 << (6U - (char)iVar4 & 0x1f)) & (uint)bVar1;
    if (iVar4 != 1) {
      if (iVar4 != 2) {
        *p = (char *)(pbVar2 + 2);
        uVar3 = uVar3 << 6 | pbVar2[1] & 0x3f;
      }
      pbVar2 = (byte *)*p;
      *p = (char *)(pbVar2 + 1);
      uVar3 = uVar3 << 6 | *pbVar2 & 0x3f;
    }
    pbVar2 = (byte *)*p;
    *p = (char *)(pbVar2 + 1);
    uVar3 = *pbVar2 & 0x3f | uVar3 << 6;
  }
  return uVar3;
}

Assistant:

static code_point decode_valid(Iterator &p)
        {
            unsigned char lead = *p++;
            if(lead < 192)
                return lead;

            int trail_size;

            if(lead < 224)
                trail_size = 1;
            else if(BOOSTER_LOCALE_LIKELY(lead < 240)) // non-BMP rare
                trail_size = 2;
            else
                trail_size = 3;
            
            code_point c = lead & ((1<<(6-trail_size))-1);

            switch(trail_size) {
            case 3:
                c = (c << 6) | ( static_cast<unsigned char>(*p++) & 0x3F);
            case 2:
                c = (c << 6) | ( static_cast<unsigned char>(*p++) & 0x3F);
            case 1:
                c = (c << 6) | ( static_cast<unsigned char>(*p++) & 0x3F);
            }

            return c;
        }